

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O0

char * end_capture(MatchState *ms,char *s,char *p)

{
  int iVar1;
  char *pcVar2;
  long in_RSI;
  long in_RDI;
  char *res;
  int l;
  char *in_stack_00000028;
  MatchState *in_stack_00000030;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  iVar1 = capture_to_close((MatchState *)
                           CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  *(long *)(in_RDI + (long)iVar1 * 0x10 + 0x28) =
       in_RSI - *(long *)(in_RDI + 0x20 + (long)iVar1 * 0x10);
  pcVar2 = match(in_stack_00000030,in_stack_00000028,(char *)ms);
  if (pcVar2 == (char *)0x0) {
    *(undefined8 *)(in_RDI + (long)iVar1 * 0x10 + 0x28) = 0xffffffffffffffff;
  }
  return pcVar2;
}

Assistant:

static const char *end_capture(MatchState *ms, const char *s,
			       const char *p)
{
  int l = capture_to_close(ms);
  const char *res;
  ms->capture[l].len = s - ms->capture[l].init;  /* close capture */
  if ((res = match(ms, s, p)) == NULL)  /* match failed? */
    ms->capture[l].len = CAP_UNFINISHED;  /* undo capture */
  return res;
}